

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O1

void __thiscall flatbuffers::FlatBufferBuilder::~FlatBufferBuilder(FlatBufferBuilder *this)

{
  pointer puVar1;
  pointer pFVar2;
  uint8_t *puVar3;
  
  puVar1 = (this->vtables_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  pFVar2 = (this->offsetbuf_).
           super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pFVar2 != (pointer)0x0) {
    operator_delete(pFVar2);
  }
  puVar3 = (this->buf_).buf_;
  if (puVar3 != (uint8_t *)0x0) {
    operator_delete__(puVar3);
    return;
  }
  return;
}

Assistant:

explicit FlatBufferBuilder(uoffset_t initial_size = 1024)
    : buf_(initial_size), minalign_(1), force_defaults_(false) {
    offsetbuf_.reserve(16);  // Avoid first few reallocs.
    vtables_.reserve(16);
    EndianCheck();
    flatbuffer_version_string =
      "FlatBuffers "
      FLATBUFFERS_STRING(FLATBUFFERS_VERSION_MAJOR) "."
      FLATBUFFERS_STRING(FLATBUFFERS_VERSION_MINOR) "."
      FLATBUFFERS_STRING(FLATBUFFERS_VERSION_REVISION);
  }